

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LangevinPiston.cpp
# Opt level: O2

void __thiscall OpenMD::LangevinPiston::evolveEtaA(LangevinPiston *this)

{
  double dVar1;
  
  dVar1 = (this->randomForce_ / this->W_ +
          ((((this->super_NPT).instaPress - (this->super_NPT).targetPressure) *
           (this->super_NPT).instaVol) / (this->W_ * 163882576.0) - this->gamma_ * this->eta)) *
          (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2 + this->eta;
  this->eta = dVar1;
  this->oldEta = dVar1;
  return;
}

Assistant:

void LangevinPiston::evolveEtaA() {
    // volume is Angs^3
    // pressures are in atm
    // pressureConvert takes amu*fs^-2*Ang^-1 -> atm
    eta += dt2 * (instaVol * (instaPress - targetPressure) /
                      (Constants::pressureConvert * W_) -
                  gamma_ * eta + randomForce_ / W_);
    oldEta = eta;
  }